

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  int iVar1;
  uint uVar2;
  int Entry;
  Vec_Wrd_t *p_00;
  word wVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  int i;
  int local_3c;
  Vec_Wrd_t *local_38;
  
  while( true ) {
    iVar1 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar1 != 0) {
      return;
    }
    Abc_NodeSetTravIdCurrent(pObj);
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar2 != 7) break;
    iVar1 = Abc_NodeIsExorType(pObj);
    if (iVar1 != 0) {
      p_00 = Abc_NtkShareSuperXor(pObj,&local_3c,&p->nFoundGates);
      iVar1 = p_00->nSize;
      if ((iVar1 < 2) || (p->nMultiSize <= iVar1)) {
        iVar6 = 0;
        local_38 = p_00;
        if (iVar1 < 1) {
          iVar1 = iVar6;
        }
        for (; p_00 = local_38, iVar1 != iVar6; iVar6 = iVar6 + 1) {
          wVar3 = Vec_WrdEntry(local_38,iVar6);
          i = (int)wVar3;
          pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vInputs,i);
          if (pVVar4 == (Vec_Int_t *)0x0) {
            pVVar4 = Vec_IntAlloc(10);
            Entry = Abc_Var2Lit(i,0);
            Vec_IntPush(pVVar4,Entry);
            pAVar5 = Abc_NtkObj(p->pNtk,i);
            Vec_IntPush(pVVar4,*(uint *)&pAVar5->field_0x14 >> 0xc);
            if (pVVar4->nSize != 2) {
              __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                            ,0x105,
                            "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                           );
            }
            Vec_PtrWriteEntry(vInputs,i,pVVar4);
          }
          Vec_IntPush(pVVar4,p->vObj2Lit->nSize);
        }
        pVVar4 = p->vObj2Lit;
        iVar6 = Abc_Var2Lit(pObj->Id,local_3c);
        Vec_IntPush(pVVar4,iVar6);
      }
      for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
        wVar3 = Vec_WrdEntry(p_00,iVar6);
        pAVar5 = Abc_NtkObj(p->pNtk,(int)wVar3);
        Abc_NtkTraverseSupersXor_rec(p,pAVar5,vInputs);
      }
      Vec_WrdFree(p_00);
      return;
    }
    Abc_NtkTraverseSupersXor_rec
              (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vInputs);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  }
  if (uVar2 == 2) {
    return;
  }
  if (uVar2 == 5) {
    return;
  }
  __assert_fail("Abc_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                ,0xf4,"void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
  ;
}

Assistant:

void Abc_NtkTraverseSupersXor_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NodeIsExorType(pObj) )
    {
        Vec_Wrd_t * vSuper;
        int k, fCompl;
        word Num;
        vSuper = Abc_NtkShareSuperXor( pObj, &fCompl, &p->nFoundGates );
        if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
        {
            Vec_WrdForEachEntry( vSuper, Num, k )
            {
                Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
                if ( vInput == NULL )
                {
                    vInput = Vec_IntAlloc( 10 );
                    Vec_IntPush( vInput, Abc_Var2Lit((int)Num, 0) );
                    Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, (int)Num)) );
                    assert( SHARE_NUM == Vec_IntSize(vInput) );
                    Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
                }
                Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
            }
            Vec_IntPush( p->vObj2Lit, Abc_Var2Lit(Abc_ObjId(pObj), fCompl) );
        }
        // call recursively
        Vec_WrdForEachEntry( vSuper, Num, k )
            Abc_NtkTraverseSupersXor_rec( p, Abc_NtkObj(p->pNtk, (int)Num), vInputs );
        Vec_WrdFree( vSuper );
    }
    else
    {
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin1(pObj), vInputs );
    }
}